

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

FilePath testing::internal::GetCurrentExecutableName(void)

{
  size_t extraout_RDX;
  FilePath *in_RDI;
  FilePath FVar1;
  FilePath result;
  String SStack_28;
  String local_18;
  
  FilePath::FilePath((FilePath *)&SStack_28);
  FilePath::FilePath((FilePath *)&local_18,(String *)g_executable_path);
  String::operator=(&SStack_28,&local_18);
  String::~String(&local_18);
  FilePath::RemoveDirectoryName(in_RDI);
  String::~String(&SStack_28);
  FVar1.pathname_.length_ = extraout_RDX;
  FVar1.pathname_.c_str_ = (char *)in_RDI;
  return (FilePath)FVar1.pathname_;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(g_executable_path).RemoveExtension("exe"));
#else
  result.Set(FilePath(g_executable_path));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}